

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O1

void test_archive_string_conversion(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  archive_conflict *paVar4;
  FILE *pFVar5;
  size_t sVar6;
  size_t v2;
  char *pcVar7;
  archive_conflict *paVar8;
  char *pcVar9;
  archive_string_conv *paVar10;
  wchar_t *pwVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  wchar_t *wp;
  char *mp;
  char nfc [80];
  char nfd [80];
  archive_mstring mstr;
  char utf8_nfc [80];
  archive_entry *ae;
  char utf8_nfd [80];
  wchar_t wc_nfc [40];
  char utf16le_nfd [80];
  char utf16le_nfc [80];
  char utf16be_nfd [80];
  char utf16be_nfc [80];
  wchar_t wc_nfd [40];
  char buff_1 [512];
  char buff [512];
  wchar_t *local_8e8;
  archive_conflict *local_8e0;
  archive_string local_8d8;
  archive_string_conv *local_8c0;
  FILE *local_8b8;
  archive_string_conv *local_8b0;
  archive_conflict *local_8a8;
  FILE *local_8a0;
  archive_conflict *local_898;
  char *local_890;
  char local_888 [79];
  undefined1 local_839;
  archive_conflict *local_838;
  size_t local_830;
  char local_828 [79];
  undefined1 local_7d9;
  archive_mstring local_7d8;
  char local_768 [88];
  archive_entry *local_710;
  char local_708 [80];
  wchar_t local_6b8 [40];
  char local_618 [80];
  char local_5c8 [80];
  char local_578 [80];
  char local_528 [80];
  wchar_t local_4d8 [40];
  archive_mstring local_438 [4];
  undefined1 local_238 [520];
  
  extract_reference_file("test_archive_string_conversion.txt.Z");
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ͣ',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͤ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_raw((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͥ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",paVar4)
  ;
  wVar2 = archive_read_open_filename(paVar4,"test_archive_string_conversion.txt.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͧ',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reffile, 512)",paVar4);
  iVar1 = archive_read_next_header((archive *)paVar4,&local_710);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͩ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pFVar5 = fopen("testdata.txt","w");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ͪ',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"w\")) != NULL",
                   (void *)0x0);
  sVar6 = archive_read_data((archive *)paVar4,local_238,0x200);
  if (0 < (long)sVar6) {
    do {
      v2 = fwrite(local_238,1,sVar6,pFVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'ͬ',sVar6,"size",v2,"fwrite(buff, 1, size, fp)",(void *)0x0);
      sVar6 = archive_read_data((archive *)paVar4,local_238,0x200);
    } while (0 < (long)sVar6);
  }
  iVar1 = fclose(pFVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͭ',0,"0",(long)iVar1,"fclose(fp)",(void *)0x0);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͮ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ċ');
    test_skipping(
                 "A test of string normalization for NFC requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8d8.s = (char *)0x0;
    local_8d8.length = 0;
    local_8d8.buffer_length = 0;
    local_7d8.aes_mbs.s = (char *)0x0;
    local_7d8.aes_mbs.length = 0;
    local_7d8.aes_mbs.buffer_length = 0;
    local_7d8.aes_utf8.s = (char *)0x0;
    local_7d8.aes_utf8.length = 0;
    local_7d8.aes_utf8.buffer_length = 0;
    local_7d8.aes_wcs.s = (wchar_t *)0x0;
    local_7d8.aes_wcs.length = 0;
    local_7d8.aes_wcs.buffer_length = 0;
    local_7d8.aes_mbs_in_locale.s = (char *)0x0;
    local_7d8.aes_mbs_in_locale.length = 0;
    local_7d8.aes_mbs_in_locale.buffer_length = 0;
    local_7d8.aes_set = L'\0';
    local_7d8._100_4_ = 0;
    paVar4 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ė',(uint)(paVar4 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    local_8a0 = (FILE *)archive_string_conversion_from_charset(paVar4,"UTF-8",L'\0');
    bVar13 = local_8a0 != (FILE *)0x0;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ę',(uint)bVar13,
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     paVar4);
    local_8e0 = (archive_conflict *)archive_string_conversion_from_charset(paVar4,"UTF-16BE",L'\0');
    bVar14 = local_8e0 != (archive_conflict *)0x0;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ě',(uint)bVar14,
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,paVar4);
    local_8c0 = archive_string_conversion_from_charset(paVar4,"UTF-16LE",L'\0');
    bVar15 = local_8c0 != (archive_string_conv *)0x0;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ĝ',(uint)bVar15,
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,paVar4);
    paVar8 = (archive_conflict *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ğ',(uint)(paVar8 != (archive_conflict *)0x0),
                     "(a2 = archive_write_new()) != NULL",(void *)0x0);
    local_898 = paVar8;
    local_8b0 = archive_string_conversion_to_charset(paVar8,"UTF-8",L'\0');
    bVar16 = local_8b0 != (archive_string_conv *)0x0;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ġ',(uint)bVar16,
                     "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))",
                     paVar4);
    if ((bVar15 && (bVar14 && bVar13)) && bVar16) {
      archive_string_conversion_set_opt((archive_string_conv *)local_8a0,L'\x02');
      archive_string_conversion_set_opt((archive_string_conv *)local_8e0,L'\x02');
      archive_string_conversion_set_opt(local_8c0,L'\x02');
      archive_string_conversion_set_opt(local_8b0,L'\x02');
      pFVar5 = fopen("testdata.txt","r");
      local_8b8 = pFVar5;
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'ĭ',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"r\")) != NULL",
                       (void *)0x0);
      pcVar7 = fgets((char *)local_438,0x200,pFVar5);
      local_8a8 = paVar4;
      if (pcVar7 != (char *)0x0) {
        uVar12 = 1;
        do {
          if ((char)local_438[0].aes_mbs.s != '#') {
            pcVar7 = strchr((char *)local_438,0x3b);
            if (pcVar7 != (char *)0x0) {
              *pcVar7 = '\0';
              strncpy(local_888,(char *)local_438,0x4f);
              local_839 = 0;
              pcVar9 = strchr(pcVar7 + 1,10);
              if (pcVar9 != (char *)0x0) {
                *pcVar9 = '\0';
                strncpy(local_828,pcVar7 + 1,0x4f);
                local_7d9 = 0;
                scan_unicode_pattern(local_768,local_6b8,local_528,local_5c8,local_888,L'\0');
                scan_unicode_pattern(local_708,local_4d8,local_578,local_618,local_828,L'\0');
                sVar6 = strlen(local_708);
                pFVar5 = local_8a0;
                wVar2 = archive_strncpy_l(&local_8d8,local_708,sVar6,
                                          (archive_string_conv *)local_8a0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ť',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
                failure("NFD(%s) should be converted to NFC(%s):%d",local_828,local_888,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ũ',local_768,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                sVar6 = strlen(local_768);
                wVar2 = archive_strncpy_l(&local_8d8,local_768,sVar6,(archive_string_conv *)pFVar5);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ů',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
                failure("NFC(%s) should not be any changed:%d",local_888,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ű',local_768,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                sVar6 = strlen(local_768);
                wVar2 = archive_strncpy_l(&local_8d8,local_768,sVar6,local_8b0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ŷ',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfc, t_sconv8)",(void *)0x0);
                failure("NFC(%s) should not be any changed:%d",local_888,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ź',local_768,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_strncpy_l(&local_8d8,local_578,100000,
                                          (archive_string_conv *)local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ƀ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16be_nfd, 100000, f_sconv16be)",
                                    (void *)0x0);
                failure("NFD(%s) should be converted to NFC(%s):%d",local_828,local_888,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ƃ',local_768,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_strncpy_l(&local_8d8,local_618,100000,local_8c0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ɖ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16le_nfd, 100000, f_sconv16le)",
                                    (void *)0x0);
                failure("NFD(%s) should be converted to NFC(%s):%d",local_828,local_888,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ƌ',local_768,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_mstring_copy_mbs_len_l
                                  (&local_7d8,local_708,100000,(archive_string_conv *)local_8a0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ƛ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfd, 100000, f_sconv8)"
                                    ,(void *)0x0);
                paVar4 = local_8a8;
                wVar2 = archive_mstring_get_wcs(local_8a8,&local_7d8,&local_8e8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ɲ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",local_828,local_888,
                        uVar12);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ơ',local_6b8,"wc_nfc",local_8e8,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l
                                  (&local_7d8,local_578,100000,(archive_string_conv *)local_8e0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ʀ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfd, 100000, f_sconv16be)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(paVar4,&local_7d8,&local_8e8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ƨ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",local_828,local_888,
                        uVar12);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ƫ',local_6b8,"wc_nfc",local_8e8,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l(&local_7d8,local_618,100000,local_8c0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ʊ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfd, 100000, f_sconv16le)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(paVar4,&local_7d8,&local_8e8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ƴ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",local_828,local_888,
                        uVar12);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ƶ',local_6b8,"wc_nfc",local_8e8,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_wcs(&local_7d8,local_6b8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ƽ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_wcs(&mstr, wc_nfc)",(void *)0x0);
                wVar2 = archive_mstring_get_mbs_l(paVar4,&local_7d8,&local_890,&local_830,local_8b0)
                ;
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ƾ',0,"0",(long)wVar2,
                                    "archive_mstring_get_mbs_l( a, &mstr, &mp, &mplen, t_sconv8)",
                                    (void *)0x0);
                failure("WCS NFC(%s) should be UTF-8 NFC:%d",local_888,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ǁ',local_768,"utf8_nfc",local_890,"mp",(void *)0x0,L'\x01');
              }
            }
          }
          pcVar7 = fgets((char *)local_438,0x200,local_8b8);
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (pcVar7 != (char *)0x0);
      }
      archive_string_free(&local_8d8);
      archive_mstring_clean(&local_7d8);
      fclose(local_8b8);
      iVar1 = archive_read_free((archive *)local_8a8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'ǈ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free((archive *)local_898);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'ǉ';
    }
    else {
      iVar1 = archive_read_free((archive *)paVar4);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'Ĥ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'Ǟ');
    test_skipping(
                 "A test of string normalization for NFD requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8d8.s = (char *)0x0;
    local_8d8.length = 0;
    local_8d8.buffer_length = 0;
    local_7d8.aes_mbs.s = (char *)0x0;
    local_7d8.aes_mbs.length = 0;
    local_7d8.aes_mbs.buffer_length = 0;
    local_7d8.aes_utf8.s = (char *)0x0;
    local_7d8.aes_utf8.length = 0;
    local_7d8.aes_utf8.buffer_length = 0;
    local_7d8.aes_wcs.s = (wchar_t *)0x0;
    local_7d8.aes_wcs.length = 0;
    local_7d8.aes_wcs.buffer_length = 0;
    local_7d8.aes_mbs_in_locale.s = (char *)0x0;
    local_7d8.aes_mbs_in_locale.length = 0;
    local_7d8.aes_mbs_in_locale.buffer_length = 0;
    local_7d8.aes_set = L'\0';
    local_7d8._100_4_ = 0;
    paVar4 = (archive_conflict *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǫ',(uint)(paVar4 != (archive_conflict *)0x0),
                     "(a = archive_read_new()) != NULL",(void *)0x0);
    local_8c0 = archive_string_conversion_from_charset(paVar4,"UTF-8",L'\0');
    bVar13 = local_8c0 != (archive_string_conv *)0x0;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǭ',(uint)bVar13,
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     paVar4);
    local_8b0 = archive_string_conversion_from_charset(paVar4,"UTF-16BE",L'\0');
    bVar14 = local_8b0 != (archive_string_conv *)0x0;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǯ',(uint)bVar14,
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,paVar4);
    local_8a8 = (archive_conflict *)archive_string_conversion_from_charset(paVar4,"UTF-16LE",L'\0');
    bVar15 = local_8a8 != (archive_conflict *)0x0;
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǰ',(uint)bVar15,
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,paVar4);
    paVar8 = (archive_conflict *)archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǳ',(uint)(paVar8 != (archive_conflict *)0x0),
                     "(a2 = archive_write_new()) != NULL",(void *)0x0);
    local_838 = paVar8;
    paVar8 = (archive_conflict *)archive_string_conversion_to_charset(paVar8,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǳ',(uint)(paVar8 != (archive_conflict *)0x0),
                     "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))",
                     paVar4);
    if ((bVar15 && (bVar14 && bVar13)) && paVar8 != (archive_conflict *)0x0) {
      archive_string_conversion_set_opt(local_8c0,L'\x04');
      archive_string_conversion_set_opt(local_8b0,L'\x04');
      archive_string_conversion_set_opt((archive_string_conv *)local_8a8,L'\x04');
      local_898 = paVar8;
      archive_string_conversion_set_opt((archive_string_conv *)paVar8,L'\x04');
      pFVar5 = fopen("testdata.txt","r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'Ȁ',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"r\")) != NULL",
                       (void *)0x0);
      local_8a0 = pFVar5;
      pcVar7 = fgets((char *)local_438,0x200,pFVar5);
      local_8e0 = paVar4;
      if (pcVar7 != (char *)0x0) {
        uVar12 = 1;
        do {
          if ((char)local_438[0].aes_mbs.s != '#') {
            pcVar7 = strchr((char *)local_438,0x3b);
            if (pcVar7 != (char *)0x0) {
              *pcVar7 = '\0';
              strncpy(local_888,(char *)local_438,0x4f);
              local_839 = 0;
              pcVar9 = strchr(pcVar7 + 1,10);
              if (pcVar9 != (char *)0x0) {
                *pcVar9 = '\0';
                strncpy(local_828,pcVar7 + 1,0x4f);
                local_7d9 = 0;
                wVar2 = scan_unicode_pattern
                                  (local_768,local_6b8,local_528,local_5c8,local_888,L'\x01');
                scan_unicode_pattern(local_708,local_4d8,local_578,local_618,local_828,L'\0');
                sVar6 = strlen(local_768);
                wVar3 = archive_strncpy_l(&local_8d8,local_768,sVar6,local_8c0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ȹ',0,"0",(long)wVar3,
                                    "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
                local_8b8 = (FILE *)CONCAT44(local_8b8._4_4_,wVar2);
                if (wVar2 == L'\0') {
                  failure("NFC(%s) should be converted to NFD(%s):%d",local_888,local_828,uVar12);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'Ɂ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                else {
                  failure("NFC(%s) should not be converted to NFD(%s):%d",local_888,local_828,uVar12
                         );
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'Ƚ',local_768,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                sVar6 = strlen(local_708);
                wVar2 = archive_strncpy_l(&local_8d8,local_708,sVar6,local_8c0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'Ɉ',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
                failure("NFD(%s) should not be any changed:%d",local_828,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɋ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                sVar6 = strlen(local_708);
                wVar2 = archive_strncpy_l(&local_8d8,local_708,sVar6,
                                          (archive_string_conv *)local_898);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ɑ',0,"0",(long)wVar2,
                                    "archive_strcpy_l( &utf8, utf8_nfd, t_sconv8)",(void *)0x0);
                failure("NFD(%s) should not be any changed:%d",local_828,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɔ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_strncpy_l(&local_8d8,local_528,100000,local_8b0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ɚ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16be_nfc, 100000, f_sconv16be)",
                                    (void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("NFC(%s) should be converted to NFD(%s):%d",local_888,local_828,uVar12);
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ɢ',local_708,"utf8_nfd",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                else {
                  failure("NFC(%s) should not be converted to NFD(%s):%d",local_888,local_828,uVar12
                         );
                  assertion_equal_string
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ɞ',local_768,"utf8_nfc",local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                }
                wVar2 = archive_strncpy_l(&local_8d8,local_5c8,100000,
                                          (archive_string_conv *)local_8a8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ɩ',0,"0",(long)wVar2,
                                    "archive_strncpy_l( &utf8, utf16le_nfc, 100000, f_sconv16le)",
                                    (void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("NFC(%s) should be converted to NFD(%s):%d",local_888,local_828,uVar12);
                  wVar2 = L'ɱ';
                  pcVar7 = local_708;
                  pcVar9 = "utf8_nfd";
                }
                else {
                  failure("NFC(%s) should not be converted to NFD(%s):%d",local_888,local_828,uVar12
                         );
                  wVar2 = L'ɭ';
                  pcVar9 = "utf8_nfc";
                  pcVar7 = local_768;
                }
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,wVar2,pcVar7,pcVar9,local_8d8.s,"utf8.s",(void *)0x0,L'\x01');
                wVar2 = archive_mstring_copy_mbs_len_l(&local_7d8,local_768,100000,local_8c0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʁ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfc, 100000, f_sconv8)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(local_8e0,&local_7d8,&local_8e8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʃ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("UTF-8 NFC(%s) should be converted to WCS NFD(%s):%d",local_888,local_828,
                          uVar12);
                  wVar2 = L'ʋ';
                  pwVar11 = local_4d8;
                  pcVar7 = "wc_nfd";
                }
                else {
                  failure("UTF-8 NFC(%s) should not be converted to WCS NFD(%s):%d",local_888,
                          local_828,uVar12);
                  wVar2 = L'ʇ';
                  pwVar11 = local_6b8;
                  pcVar7 = "wc_nfc";
                }
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,wVar2,pwVar11,pcVar7,local_8e8,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l(&local_7d8,local_528,100000,local_8b0);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʒ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfc, 100000, f_sconv16be)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(local_8e0,&local_7d8,&local_8e8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʔ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("UTF-16BE NFC(%s) should be converted to WCS NFD(%s):%d",local_888,
                          local_828,uVar12);
                  wVar2 = L'ʝ';
                  pwVar11 = local_4d8;
                  pcVar7 = "wc_nfd";
                }
                else {
                  failure("UTF-16BE NFC(%s) should not be converted to WCS NFD(%s):%d",local_888,
                          local_828,uVar12);
                  wVar2 = L'ʙ';
                  pwVar11 = local_6b8;
                  pcVar7 = "wc_nfc";
                }
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,wVar2,pwVar11,pcVar7,local_8e8,"wp",(void *)0x0);
                wVar2 = archive_mstring_copy_mbs_len_l
                                  (&local_7d8,local_5c8,100000,(archive_string_conv *)local_8a8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʤ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfc, 100000, f_sconv16le)"
                                    ,(void *)0x0);
                wVar2 = archive_mstring_get_wcs(local_8e0,&local_7d8,&local_8e8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʦ',0,"0",(long)wVar2,
                                    "archive_mstring_get_wcs(a, &mstr, &wp)",(void *)0x0);
                if ((int)local_8b8 == 0) {
                  failure("UTF-16LE NFC(%s) should be converted to WCS NFD(%s):%d",local_888,
                          local_828,uVar12);
                  assertion_equal_wstring
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ʯ',local_4d8,"wc_nfd",local_8e8,"wp",(void *)0x0);
                }
                else {
                  failure("UTF-16LE NFC(%s) should not be converted to WCS NFD(%s):%d",local_888,
                          local_828,uVar12);
                  assertion_equal_wstring
                            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ʫ',local_6b8,"wc_nfc",local_8e8,"wp",(void *)0x0);
                }
                paVar4 = local_898;
                wVar2 = archive_mstring_copy_wcs(&local_7d8,local_4d8);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʶ',0,"0",(long)wVar2,
                                    "archive_mstring_copy_wcs( &mstr, wc_nfd)",(void *)0x0);
                wVar2 = archive_mstring_get_mbs_l
                                  (local_8e0,&local_7d8,&local_890,&local_830,
                                   (archive_string_conv *)paVar4);
                assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                    ,L'ʸ',0,"0",(long)wVar2,
                                    "archive_mstring_get_mbs_l( a, &mstr, &mp, &mplen, t_sconv8)",
                                    (void *)0x0);
                failure("WCS NFD(%s) should be UTF-8 NFD:%d",local_828,uVar12);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ʻ',local_708,"utf8_nfd",local_890,"mp",(void *)0x0,L'\x01');
              }
            }
          }
          pcVar7 = fgets((char *)local_438,0x200,local_8a0);
          uVar12 = (ulong)((int)uVar12 + 1);
        } while (pcVar7 != (char *)0x0);
      }
      archive_string_free(&local_8d8);
      archive_mstring_clean(&local_7d8);
      fclose(local_8a0);
      iVar1 = archive_read_free((archive *)local_8e0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'˂',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free((archive *)local_838);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'˃';
    }
    else {
      iVar1 = archive_read_free((archive *)paVar4);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'Ƿ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  setlocale(6,"en_US.UTF-8");
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ˎ',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  paVar10 = archive_string_conversion_to_charset(paVar4,"UTF-8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ˑ',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-8\", 1))",paVar4)
  ;
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˔',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"UTF8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˗',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˚',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"utf8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˝',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˠ',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"UTF-16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ˣ',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˦',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"UTF16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˩',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˬ',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"utf16be",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˯',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16be\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˲',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"UTF-16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˵',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˸',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"UTF16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˻',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˾',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar10 = archive_string_conversion_to_charset(paVar4,"utf16le",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'́',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16le\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̄',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̆',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  setlocale(6,"en_US.UTF-8");
  paVar4 = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̼',(uint)(paVar4 != (archive_conflict *)0x0),
                   "(a = archive_read_new()) != NULL",(void *)0x0);
  local_438[0].aes_mbs.s = (char *)0x0;
  local_438[0].aes_mbs.length = 0;
  local_438[0].aes_mbs.buffer_length = 0;
  local_438[0].aes_utf8.s = (char *)0x0;
  local_438[0].aes_utf8.length = 0;
  local_438[0].aes_utf8.buffer_length = 0;
  local_438[0].aes_wcs.s = (wchar_t *)0x0;
  local_438[0].aes_wcs.length = 0;
  local_438[0].aes_wcs.buffer_length = 0;
  local_438[0].aes_mbs_in_locale.s = (char *)0x0;
  local_438[0].aes_mbs_in_locale.length = 0;
  local_438[0].aes_mbs_in_locale.buffer_length = 0;
  local_438[0].aes_set = L'\0';
  local_438[0]._100_4_ = 0;
  paVar10 = archive_string_conversion_to_charset(paVar4,"UTF-8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̀',(uint)(paVar10 != (archive_string_conv *)0x0),
                   "NULL != (sc = archive_string_conversion_to_charset(a, \"UTF-8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar10);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̓',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sc)",
             (void *)0x0,L'\0');
  wVar2 = archive_mstring_copy_mbs(local_438,"AAA");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'ͅ',0,"0",(long)wVar2,"archive_mstring_copy_mbs(&mstr, \"AAA\")",
                      (void *)0x0);
  check_string((archive *)paVar4,local_438,paVar10,"AAA",L"AAA");
  wVar2 = archive_mstring_copy_utf8(local_438,"BBBB");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͇',4,"4",(long)wVar2,"archive_mstring_copy_utf8(&mstr, \"BBBB\")",
                      (void *)0x0);
  check_string((archive *)paVar4,local_438,paVar10,"BBBB",L"BBBB");
  wVar2 = archive_mstring_copy_wcs(local_438,L"CCC12");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͉',0,"0",(long)wVar2,"archive_mstring_copy_wcs(&mstr, L\"CCC12\")",
                      (void *)0x0);
  check_string((archive *)paVar4,local_438,paVar10,"CCC12",L"CCC12");
  wVar2 = archive_mstring_copy_mbs_len_l(local_438,"DDDD-l",6,paVar10);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͋',0,"0",(long)wVar2,
                      "archive_mstring_copy_mbs_len_l(&mstr, \"DDDD-l\", 6, sc)",(void *)0x0);
  check_string((archive *)paVar4,local_438,paVar10,"DDDD-l",L"DDDD-l");
  wVar2 = archive_mstring_update_utf8(paVar4,local_438,"EEEEE---H");
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͍',0,"0",(long)wVar2,
                      "archive_mstring_update_utf8(a, &mstr, \"EEEEE---H\")",(void *)0x0);
  check_string((archive *)paVar4,local_438,paVar10,"EEEEE---H",L"EEEEE---H");
  archive_mstring_clean(local_438);
  iVar1 = archive_read_free((archive *)paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'͑',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_conversion)
{
	static const char reffile[] = "test_archive_string_conversion.txt.Z";
	static const char testdata[] = "testdata.txt";
	struct archive *a;
	struct archive_entry *ae;
	char buff[512];
	ssize_t size;
	FILE *fp;

	/*
	 * Extract a test pattern file.
	 */
	extract_reference_file(reffile);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
        assertEqualIntA(a, ARCHIVE_OK,
            archive_read_open_filename(a, reffile, 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assert((fp = fopen(testdata, "w")) != NULL);
	while ((size = archive_read_data(a, buff, 512)) > 0)
		assertEqualInt(size, fwrite(buff, 1, size, fp));
	assertEqualInt(0, fclose(fp));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	test_archive_string_normalization_nfc(testdata);
	test_archive_string_normalization_mac_nfd(testdata);
	test_archive_string_canonicalization();
	test_archive_string_set_get();
}